

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareMapField
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *__x;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  MapFieldBase *pMVar4;
  Descriptor *pDVar5;
  FieldDescriptor *field;
  int unpacked_any_00;
  Metadata MVar6;
  Metadata MVar7;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  current_parent_fields;
  FieldDescriptor *local_c8;
  int local_bc;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *local_b8;
  _Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  local_b0;
  FieldDescriptor *local_98;
  value_type local_90;
  
  local_c8 = repeated_field;
  bVar1 = FieldDescriptor::is_map(repeated_field);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer.cc"
               ,0x49b,"repeated_field->is_map()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_90);
  }
  local_bc = unpacked_any;
  local_b8 = parent_fields;
  MVar6 = Message::GetMetadata(message1);
  MVar7 = Message::GetMetadata(message2);
  pMVar4 = Reflection::GetMapData(MVar6.reflection,message1,repeated_field);
  bVar1 = internal::MapFieldBase::IsMapValid(pMVar4);
  unpacked_any_00 = local_bc;
  if (bVar1) {
    pMVar4 = Reflection::GetMapData(MVar7.reflection,message2,repeated_field);
    bVar1 = internal::MapFieldBase::IsMapValid(pMVar4);
    unpacked_any_00 = local_bc;
    if ((bVar1) && (this->reporter_ == (Reporter *)0x0)) {
      local_90._0_16_ =
           absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>>>
           ::find<google::protobuf::FieldDescriptor_const*>
                     ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>>>
                       *)&this->map_field_key_comparator_,&local_c8);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
                  *)&this->map_field_key_comparator_);
      local_b0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bVar1 = absl::lts_20250127::container_internal::operator==
                        ((iterator *)&local_90,(iterator *)&local_b0);
      __x = local_b8;
      unpacked_any_00 = local_bc;
      if ((bVar1) &&
         ((this->repeated_field_comparison_ == AS_LIST &&
          (this->field_comparator_kind_ == kFCDefault)))) {
        pDVar5 = FieldDescriptor::message_type(local_c8);
        field = Descriptor::map_key(pDVar5);
        pDVar5 = FieldDescriptor::message_type(local_c8);
        local_98 = Descriptor::map_value(pDVar5);
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::vector((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  *)&local_b0,__x);
        local_90.unknown_field_number = -1;
        local_90.unknown_field_type = TYPE_VARINT;
        local_90.index = -1;
        local_90.new_index = -1;
        local_90.map_entry1 = (Message *)0x0;
        local_90.map_entry2 = (Message *)0x0;
        local_90.unknown_field_set1 = (UnknownFieldSet *)0x0;
        local_90.unknown_field_set2 = (UnknownFieldSet *)0x0;
        local_90.unknown_field_index1 = -1;
        local_90.unknown_field_index2 = -1;
        local_90.forced_compare_no_presence_ = false;
        local_90.message2 = message2;
        local_90.message1 = message1;
        local_90.unpacked_any = unpacked_any_00;
        local_90.field = local_c8;
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::push_back((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     *)&local_b0,&local_90);
        bVar2 = IsIgnored(this,message1,message2,field,
                          (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           *)&local_b0);
        bVar1 = true;
        if ((!bVar2) &&
           (bVar2 = IsIgnored(this,message1,message2,local_98,
                              (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                               *)&local_b0), !bVar2)) {
          bVar1 = CompareMapFieldByMapReflection
                            (this,message1,message2,unpacked_any_00,local_c8,
                             (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                              *)&local_b0,(this->field_comparator_).default_impl);
          field = (FieldDescriptor *)(ulong)bVar1;
          bVar1 = false;
        }
        bVar3 = (byte)field;
        std::
        _Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::~_Vector_base(&local_b0);
        if (!bVar1) goto LAB_0027d80a;
      }
    }
  }
  bVar3 = CompareRepeatedRep(this,message1,message2,unpacked_any_00,local_c8,local_b8);
LAB_0027d80a:
  return (bool)(bVar3 & 1);
}

Assistant:

bool MessageDifferencer::CompareMapField(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    std::vector<SpecificField>* parent_fields) {
  ABSL_DCHECK(repeated_field->is_map());

  // the input FieldDescriptor is guaranteed to be repeated field.
  const Reflection* reflection1 = message1.GetReflection();
  const Reflection* reflection2 = message2.GetReflection();

  // When both map fields are on map, do not sync to repeated field.
  if (reflection1->GetMapData(message1, repeated_field)->IsMapValid() &&
      reflection2->GetMapData(message2, repeated_field)->IsMapValid() &&
      // TODO: Add support for reporter
      reporter_ == nullptr &&
      // Users didn't set custom map field key comparator
      map_field_key_comparator_.find(repeated_field) ==
          map_field_key_comparator_.end() &&
      // Users didn't set repeated field comparison
      repeated_field_comparison_ == AS_LIST &&
      // Users didn't set their own FieldComparator implementation
      field_comparator_kind_ == kFCDefault) {
    const FieldDescriptor* key_des = repeated_field->message_type()->map_key();
    const FieldDescriptor* val_des =
        repeated_field->message_type()->map_value();
    std::vector<SpecificField> current_parent_fields(*parent_fields);
    SpecificField specific_field;
    specific_field.message1 = &message1;
    specific_field.message2 = &message2;
    specific_field.unpacked_any = unpacked_any;
    specific_field.field = repeated_field;
    current_parent_fields.push_back(specific_field);
    if (!IsIgnored(message1, message2, key_des, current_parent_fields) &&
        !IsIgnored(message1, message2, val_des, current_parent_fields)) {
      return CompareMapFieldByMapReflection(
          message1, message2, unpacked_any, repeated_field,
          &current_parent_fields, field_comparator_.default_impl);
    }
  }

  return CompareRepeatedRep(message1, message2, unpacked_any, repeated_field,
                            parent_fields);
}